

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLNode::InsertChildPreamble(XMLNode *this,XMLNode *insertThis)

{
  int iVar1;
  XMLNode *pXVar2;
  XMLDocument *pXVar3;
  XMLNode **ppXVar4;
  long lVar5;
  long lVar6;
  
  pXVar2 = insertThis->_parent;
  if (pXVar2 != (XMLNode *)0x0) {
    if (pXVar2->_firstChild == insertThis) {
      pXVar2->_firstChild = pXVar2->_firstChild->_next;
    }
    if (pXVar2->_lastChild == insertThis) {
      pXVar2->_lastChild = pXVar2->_lastChild->_prev;
    }
    pXVar2 = insertThis->_prev;
    if (pXVar2 != (XMLNode *)0x0) {
      pXVar2->_next = insertThis->_next;
    }
    if (insertThis->_next != (XMLNode *)0x0) {
      insertThis->_next->_prev = pXVar2;
    }
    insertThis->_parent = (XMLNode *)0x0;
    insertThis->_prev = (XMLNode *)0x0;
    insertThis->_next = (XMLNode *)0x0;
    return;
  }
  pXVar3 = insertThis->_document;
  iVar1 = (pXVar3->_unlinked)._size;
  lVar5 = (long)iVar1;
  if (0 < lVar5) {
    ppXVar4 = (pXVar3->_unlinked)._mem;
    lVar6 = 0;
    do {
      if (ppXVar4[lVar6] == insertThis) {
        ppXVar4[lVar6] = ppXVar4[lVar5 + -1];
        (pXVar3->_unlinked)._size = iVar1 + -1;
        break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  (*insertThis->_memPool->_vptr_MemPool[5])();
  return;
}

Assistant:

void XMLNode::InsertChildPreamble( XMLNode* insertThis ) const
{
    TIXMLASSERT( insertThis );
    TIXMLASSERT( insertThis->_document == _document );

	if (insertThis->_parent) {
        insertThis->_parent->Unlink( insertThis );
	}
	else {
		insertThis->_document->MarkInUse(insertThis);
        insertThis->_memPool->SetTracked();
	}
}